

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O2

int poptGlob(poptContext con,char *pattern,int *acp,char ***avp)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  size_t sVar4;
  char *__dest;
  glob_t _g;
  
  iVar1 = glob_pattern_p((char *)con,0);
  if (iVar1 == 0) {
    if (pattern != (char *)0x0) {
      pattern[0] = '\x01';
      pattern[1] = '\0';
      pattern[2] = '\0';
      pattern[3] = '\0';
    }
    iVar1 = 0;
    if (acp != (int *)0x0) {
      puVar3 = (undefined8 *)calloc(2,8);
      *(undefined8 **)acp = puVar3;
      if (puVar3 != (undefined8 *)0x0) {
        sVar4 = strlen((char *)con);
        __dest = (char *)malloc(sVar4 + 1);
        if (__dest == (char *)0x0) {
          fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
          exit(1);
        }
        strcpy(__dest,(char *)con);
        *puVar3 = __dest;
      }
    }
  }
  else {
    iVar1 = 0;
    iVar2 = glob((char *)con,0,poptGlob_error,(glob_t *)&_g);
    if (iVar2 == 3) {
      acp[0] = 0;
      acp[1] = 0;
      pattern[0] = '\0';
      pattern[1] = '\0';
      pattern[2] = '\0';
      pattern[3] = '\0';
    }
    else if (iVar2 == 0) {
      if (pattern != (char *)0x0) {
        *(undefined4 *)pattern = (undefined4)_g.gl_pathc;
        _g.gl_pathc = 0;
      }
      if (acp != (int *)0x0) {
        *(char ***)acp = _g.gl_pathv;
        _g.gl_pathv = (char **)0x0;
      }
      globfree((glob_t *)&_g);
      iVar1 = 0;
    }
    else {
      iVar1 = -0x10;
    }
  }
  return iVar1;
}

Assistant:

static int poptGlob(UNUSED(poptContext con), const char * pattern,
		int * acp, const char *** avp)
{
    const char * pat = pattern;
    int rc = 0;		/* assume success */

#if defined(HAVE_GLOB_H)
    if (glob_pattern_p(pat, 0)) {
	glob_t _g, *pglob = &_g;

	if (!(rc = glob(pat, poptGlobFlags, poptGlob_error, pglob))) {
	    if (acp) {
		*acp = (int) pglob->gl_pathc;
		pglob->gl_pathc = 0;
	    }
	    if (avp) {
		*avp = (const char **) pglob->gl_pathv;
		pglob->gl_pathv = NULL;
	    }
	    globfree(pglob);
	} else if (rc == GLOB_NOMATCH) {
	    *avp = NULL;
	    *acp = 0;
	    rc = 0;
	} else
	    rc = POPT_ERROR_ERRNO;
    } else
#endif	/* HAVE_GLOB_H */
    {
	if (acp)
	    *acp = 1;
	if (avp && (*avp = calloc((size_t)(1 + 1), sizeof (**avp))) != NULL)
	    (*avp)[0] = xstrdup(pat);
    }

    return rc;
}